

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

ArrayRegOpnd * __thiscall IR::ArrayRegOpnd::CloneDefInternalSub(ArrayRegOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArrayRegOpnd *pAVar4;
  StackSym *local_58;
  StackSym *local_48;
  StackSym *local_38;
  StackSym *local_28;
  Func *func_local;
  ArrayRegOpnd *this_local;
  
  if ((this->super_RegOpnd).super_Opnd.m_kind == OpndKindReg) {
    bVar2 = RegOpnd::IsArrayRegOpnd(&this->super_RegOpnd);
    if (bVar2) goto LAB_0082b38d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                     ,0x559,"(m_kind == OpndKindReg && this->IsArrayRegOpnd())",
                     "m_kind == OpndKindReg && this->IsArrayRegOpnd()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 0;
LAB_0082b38d:
  if ((this->super_RegOpnd).m_sym == (StackSym *)0x0) {
    local_28 = (StackSym *)0x0;
  }
  else {
    local_28 = StackSym::CloneDef((this->super_RegOpnd).m_sym,func);
  }
  if (this->headSegmentSym == (StackSym *)0x0) {
    local_38 = (StackSym *)0x0;
  }
  else {
    local_38 = StackSym::CloneUse(this->headSegmentSym,func);
  }
  if (this->headSegmentLengthSym == (StackSym *)0x0) {
    local_48 = (StackSym *)0x0;
  }
  else {
    local_48 = StackSym::CloneUse(this->headSegmentLengthSym,func);
  }
  if (this->lengthSym == (StackSym *)0x0) {
    local_58 = (StackSym *)0x0;
  }
  else {
    local_58 = StackSym::CloneUse(this->lengthSym,func);
  }
  pAVar4 = Clone(this,local_28,local_38,local_48,local_58,func);
  return pAVar4;
}

Assistant:

ArrayRegOpnd *ArrayRegOpnd::CloneDefInternalSub(Func *func)
{
    Assert(m_kind == OpndKindReg && this->IsArrayRegOpnd());
    return
        Clone(
            m_sym ? m_sym->CloneDef(func) : nullptr,
            headSegmentSym ? headSegmentSym->CloneUse(func) : nullptr,
            headSegmentLengthSym ? headSegmentLengthSym->CloneUse(func) : nullptr,
            lengthSym ? lengthSym->CloneUse(func) : nullptr,
            func);
}